

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O1

bool chain::str::equal<(chain::str::case_t)1>(string_view left,string_view right)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  difference_type __d1;
  bool bVar6;
  
  sVar4 = left._M_len;
  if (sVar4 != right._M_len) {
    return false;
  }
  bVar6 = sVar4 == 0;
  if (!bVar6) {
    bVar1 = *right._M_str;
    iVar2 = tolower((uint)(byte)*left._M_str);
    iVar3 = tolower((uint)bVar1);
    if (iVar2 == iVar3) {
      sVar5 = 1;
      do {
        if (sVar4 == sVar5) {
          return sVar4 == sVar5;
        }
        bVar1 = right._M_str[sVar5];
        iVar2 = tolower((uint)(byte)left._M_str[sVar5]);
        iVar3 = tolower((uint)bVar1);
        sVar5 = sVar5 + 1;
      } while (iVar2 == iVar3);
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

auto equal(std::string_view left, std::string_view right) -> bool
{
    if (left.length() == right.length())
    {
        if constexpr (case_type == case_t::sensitive)
        {
            return left == right;
        }
        else
        {
            return std::equal(left.begin(), left.end(), right.begin(), right.end(), equal_uchar<case_t::insensitive>);
        }
    }

    return false;
}